

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pager.c
# Opt level: O2

int dowhatisinv(obj *obj)

{
  uchar uVar1;
  short sVar2;
  char *pcVar3;
  objclass *poVar4;
  byte *inp;
  bool bVar5;
  objclass **ppoVar6;
  byte bVar7;
  
  if (obj == (obj *)0x0) {
    obj = getobj("\x14","examine",(obj **)0x0);
  }
  poVar4 = objects;
  bVar5 = obj == &zeroobj || obj == (obj *)0x0;
  ppoVar6 = (objclass **)(ulong)bVar5;
  if (bVar5) {
    return 0;
  }
  uVar1 = obj->onamelth;
  if ((uVar1 != '\0') && ((obj->field_0x4a & 0x30) != 0)) {
    inp = (byte *)((long)obj->oextra + (long)obj->oxlth);
    bVar7 = *inp;
    bVar5 = (byte)(bVar7 + 0xbf) < 0x1a || bVar7 == 0;
    ppoVar6 = (objclass **)((long)obj->oextra + (long)obj->oxlth + 1);
    while ((bVar7 != 0 && (bVar5))) {
      if ((0x19 < (byte)((bVar7 & 0xdf) + 0xbf)) &&
         ((0x2d < bVar7 || ((0x208100000000U >> ((ulong)bVar7 & 0x3f) & 1) == 0)))) {
        bVar5 = false;
      }
      bVar7 = *(byte *)ppoVar6;
      ppoVar6 = (objclass **)((long)ppoVar6 + 1);
    }
    if (bVar5) goto LAB_002015b3;
  }
  sVar2 = obj->otyp;
  if ((sVar2 != 0xf6) && (sVar2 != 0x10e)) {
    if (sVar2 == 0x10f) {
      ppoVar6 = (objclass **)(long)obj->corpsenm;
      if ((long)ppoVar6 < 0) goto LAB_00201565;
      if ((obj->field_0x4a & 0x10) == 0) {
        ppoVar6 = (objclass **)((long)ppoVar6 * 3);
        bVar7 = *(byte *)((long)ppoVar6 + 0x314012) & 8;
        goto joined_r0x00201563;
      }
    }
    else if (sVar2 != 0x215) {
      if (((sVar2 == 0x129) && (obj->spe < '\x01')) && (-1 < obj->corpsenm)) {
        bVar7 = obj->field_0x4a & 0x10;
joined_r0x00201563:
        if (bVar7 != 0) goto LAB_0020159c;
      }
LAB_00201565:
      ppoVar6 = &objects;
      pcVar3 = objects[sVar2].oc_uname;
      obj->onamelth = '\0';
      poVar4[sVar2].oc_uname = (char *)0x0;
      inp = (byte *)xname_single(obj);
      obj->onamelth = uVar1;
      poVar4[sVar2].oc_uname = pcVar3;
      goto LAB_002015b3;
    }
  }
LAB_0020159c:
  inp = (byte *)mons_mname(mons + obj->corpsenm);
LAB_002015b3:
  checkfile((char *)inp,(permonst *)0x1,'\x01',(boolean)ppoVar6);
  return 0;
}

Assistant:

int dowhatisinv(struct obj *obj)
{
	static const char allowall[] = { ALL_CLASSES, 0 };

	if (!obj)
	    obj = getobj(allowall, "examine", NULL);
	if (!obj || obj == &zeroobj)
	    return 0;

	/* Fake user_typed_name for feedback on failure to find an entry. */
	checkfile(database_oname(obj), NULL, TRUE, TRUE);

	return 0;
}